

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_opt_math.c
# Opt level: O2

_Bool math_sin(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  double __x;
  gravity_class_t *pgVar1;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar2;
  gravity_value_t value;
  
  pgVar1 = args[1].isa;
  __x = (double)args[1].field_1.n;
  if (pgVar1 == gravity_class_null && __x == 0.0) {
    aVar2.n = 0;
    pgVar1 = gravity_class_int;
  }
  else if (pgVar1 == gravity_class_int) {
    aVar2.f = sin((double)(long)__x);
    pgVar1 = gravity_class_float;
  }
  else if (pgVar1 == gravity_class_float) {
    aVar2.f = sin(__x);
    pgVar1 = gravity_class_float;
  }
  else {
    aVar2.n = 1;
    pgVar1 = gravity_class_null;
  }
  value.field_1.n = aVar2.n;
  value.isa = pgVar1;
  gravity_vm_setslot(vm,value,rindex);
  return true;
}

Assistant:

static bool math_sin (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(vm, nargs)
    gravity_value_t value = GET_VALUE(1);

    if (VALUE_ISA_NULL(value)) {
        RETURN_VALUE(VALUE_FROM_INT(0), rindex);
    }

    if (VALUE_ISA_INT(value)) {
        gravity_float_t computed_value = (gravity_float_t)SIN((gravity_float_t)value.n);
        RETURN_VALUE(VALUE_FROM_FLOAT(computed_value), rindex);
    }

    if (VALUE_ISA_FLOAT(value)) {
        gravity_float_t computed_value = (gravity_float_t)SIN((gravity_float_t)value.f);
        RETURN_VALUE(VALUE_FROM_FLOAT(computed_value), rindex);
    }

    // should be NaN
    RETURN_VALUE(VALUE_FROM_UNDEFINED, rindex);
}